

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityCosseratAdvancedGenericFPM::UpdateEMatrix
          (ChElasticityCosseratAdvancedGenericFPM *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  ChMatrixNM<double,_6,_6> *pCVar27;
  undefined1 (*pauVar28) [64];
  Index outer;
  long lVar29;
  ActualDstType actualDst;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  type tmp;
  SrcEvaluatorType srcEvaluator;
  double local_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double local_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double local_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double local_1e0;
  double dStack_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double local_1a0;
  double dStack_198;
  double dStack_190;
  double dStack_188;
  undefined8 auStack_180 [6];
  undefined8 auStack_150 [6];
  undefined8 auStack_120 [6];
  undefined8 auStack_f0 [6];
  undefined8 auStack_c0 [6];
  undefined8 auStack_90 [16];
  
  if (this->updated == false) {
    pauVar28 = (undefined1 (*) [64])&local_2a0;
    ComputeTransformMatrix(this);
    auVar2 = *(undefined1 (*) [16])
              (this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array;
    auVar3 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 2);
    auVar4 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 4);
    auVar5 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 6);
    auVar6 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0xc);
    auVar7 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x12);
    auVar8 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x18);
    auVar9 = *(undefined1 (*) [16])
              ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1e);
    auVar10 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 8);
    auVar11 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0xe);
    auVar12 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x14);
    auVar13 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x1a);
    auVar14 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x20);
    auVar15 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 10);
    auVar16 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x10);
    auVar17 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x16);
    auVar18 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x1c);
    auVar19 = *(undefined1 (*) [16])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x22);
    pCVar27 = &this->Klaw;
    lVar29 = 4;
    do {
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0];
      auVar30 = vmovddup_avx512vl(auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[6];
      auVar31 = vmovddup_avx512vl(auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0xc];
      auVar32 = vmovddup_avx512vl(auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x12];
      auVar33 = vmovddup_avx512vl(auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x18];
      auVar34 = vmovddup_avx512vl(auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
           array[0x1e];
      auVar35 = vmovddup_avx512vl(auVar35);
      pCVar27 = (ChMatrixNM<double,_6,_6> *)
                ((pCVar27->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                 m_data.array + 1);
      auVar36 = vmulpd_avx512vl(auVar2,auVar30);
      auVar37 = vmulpd_avx512vl(auVar3,auVar30);
      auVar30 = vmulpd_avx512vl(auVar4,auVar30);
      auVar36 = vfmadd231pd_avx512vl(auVar36,auVar5,auVar31);
      auVar37 = vfmadd231pd_avx512vl(auVar37,auVar10,auVar31);
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar15,auVar31);
      auVar31 = vfmadd231pd_avx512vl(auVar36,auVar6,auVar32);
      auVar36 = vfmadd231pd_avx512vl(auVar37,auVar11,auVar32);
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar16,auVar32);
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar7,auVar33);
      auVar32 = vfmadd231pd_avx512vl(auVar36,auVar12,auVar33);
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar17,auVar33);
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar8,auVar34);
      auVar32 = vfmadd231pd_avx512vl(auVar32,auVar13,auVar34);
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar18,auVar34);
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar9,auVar35);
      auVar32 = vfmadd231pd_avx512vl(auVar32,auVar14,auVar35);
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar19,auVar35);
      *(undefined1 (*) [16])(&local_1a0 + lVar29) = auVar31;
      *(undefined1 (*) [16])(&dStack_190 + lVar29) = auVar32;
      *(undefined1 (*) [16])(auStack_180 + lVar29) = auVar30;
      lVar29 = lVar29 + 6;
    } while (lVar29 != 0x28);
    auVar20 = *(undefined1 (*) [64])
               (this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array;
    auVar21 = *(undefined1 (*) [64])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 6);
    auVar22 = *(undefined1 (*) [64])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0xc);
    auVar23 = *(undefined1 (*) [64])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x12);
    auVar24 = *(undefined1 (*) [64])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x18);
    lVar29 = 0;
    auVar25 = *(undefined1 (*) [64])
               ((this->T).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array + 0x1e);
    do {
      uVar1 = auStack_150[lVar29];
      auVar38._8_8_ = uVar1;
      auVar38._0_8_ = uVar1;
      auVar38._16_8_ = uVar1;
      auVar38._24_8_ = uVar1;
      auVar38._32_8_ = uVar1;
      auVar38._40_8_ = uVar1;
      auVar38._48_8_ = uVar1;
      auVar38._56_8_ = uVar1;
      auVar38 = vmulpd_avx512f(auVar21,auVar38);
      uVar1 = auStack_120[lVar29];
      auVar39._8_8_ = uVar1;
      auVar39._0_8_ = uVar1;
      auVar39._16_8_ = uVar1;
      auVar39._24_8_ = uVar1;
      auVar39._32_8_ = uVar1;
      auVar39._40_8_ = uVar1;
      auVar39._48_8_ = uVar1;
      auVar39._56_8_ = uVar1;
      auVar39 = vmulpd_avx512f(auVar22,auVar39);
      uVar1 = auStack_180[lVar29];
      auVar40._8_8_ = uVar1;
      auVar40._0_8_ = uVar1;
      auVar40._16_8_ = uVar1;
      auVar40._24_8_ = uVar1;
      auVar40._32_8_ = uVar1;
      auVar40._40_8_ = uVar1;
      auVar40._48_8_ = uVar1;
      auVar40._56_8_ = uVar1;
      auVar40 = vmulpd_avx512f(auVar20,auVar40);
      uVar1 = auStack_c0[lVar29];
      auVar41._8_8_ = uVar1;
      auVar41._0_8_ = uVar1;
      auVar41._16_8_ = uVar1;
      auVar41._24_8_ = uVar1;
      auVar41._32_8_ = uVar1;
      auVar41._40_8_ = uVar1;
      auVar41._48_8_ = uVar1;
      auVar41._56_8_ = uVar1;
      auVar41 = vmulpd_avx512f(auVar24,auVar41);
      uVar1 = auStack_90[lVar29];
      auVar42._8_8_ = uVar1;
      auVar42._0_8_ = uVar1;
      auVar42._16_8_ = uVar1;
      auVar42._24_8_ = uVar1;
      auVar42._32_8_ = uVar1;
      auVar42._40_8_ = uVar1;
      auVar42._48_8_ = uVar1;
      auVar42._56_8_ = uVar1;
      auVar42 = vmulpd_avx512f(ZEXT4864(auVar25._0_48_),auVar42);
      auVar38 = vaddpd_avx512f(auVar38,auVar39);
      auVar39 = vaddpd_avx512f(auVar41,auVar42);
      auVar38 = vaddpd_avx512f(auVar40,auVar38);
      uVar1 = auStack_f0[lVar29];
      auVar26._8_8_ = uVar1;
      auVar26._0_8_ = uVar1;
      auVar26._16_8_ = uVar1;
      auVar26._24_8_ = uVar1;
      auVar26._32_8_ = uVar1;
      auVar26._40_8_ = uVar1;
      auVar26._48_8_ = uVar1;
      auVar26._56_8_ = uVar1;
      auVar40 = vmulpd_avx512f(auVar23,auVar26);
      lVar29 = lVar29 + 1;
      auVar39 = vaddpd_avx512f(auVar40,auVar39);
      auVar38 = vaddpd_avx512f(auVar38,auVar39);
      auVar43._0_48_ = auVar38._0_48_;
      auVar43._48_8_ = *(undefined8 *)(*pauVar28 + 0x30);
      auVar43._56_8_ = *(undefined8 *)(*pauVar28 + 0x38);
      *pauVar28 = auVar43;
      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x30);
    } while (lVar29 != 6);
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = local_2a0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [1] = dStack_298;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [2] = dStack_290;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [3] = dStack_288;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [4] = dStack_280;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [5] = dStack_278;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [6] = dStack_270;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [7] = dStack_268;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [8] = local_260;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [9] = dStack_258;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [10] = dStack_250;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xb] = dStack_248;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xc] = local_240;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xd] = dStack_238;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xe] = dStack_230;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = dStack_228;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x10] = local_220;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x11] = dStack_218;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x12] = dStack_210;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x13] = dStack_208;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x14] = local_200;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x15] = dStack_1f8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x16] = dStack_1f0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x17] = dStack_1e8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x18] = local_1e0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x19] = dStack_1d8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1a] = dStack_1d0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1b] = dStack_1c8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1c] = local_1c0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1d] = dStack_1b8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1e] = dStack_1b0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1f] = dStack_1a8;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x20] = local_1a0;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x21] = dStack_198;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x22] = dStack_190;
    (this->Klaw).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x23] = dStack_188;
    this->updated = true;
  }
  return;
}

Assistant:

void ChElasticityCosseratAdvancedGenericFPM::UpdateEMatrix() {
    if (!updated) {  // do it only once
        // compute T
        ComputeTransformMatrix();
        // update Klaw after setting section rotation and EC/SC offset
        this->Klaw = this->T.transpose() * this->Klaw * this->T;
        updated = true;
    }
}